

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>::int_writer<int,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<3>_>
             *this,truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it)

{
  truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> it_00;
  truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> __first;
  size_t sVar1;
  size_t *in_RSI;
  long in_RDI;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff90;
  truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *in_stack_ffffffffffffff98;
  bin_writer<3> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  size_t in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  size_t local_20;
  undefined4 local_18;
  
  sVar1 = basic_string_view<char>::size((basic_string_view<char> *)(in_RDI + 8));
  if (sVar1 != 0) {
    basic_string_view<char>::begin((basic_string_view<char> *)(in_RDI + 8));
    basic_string_view<char>::end((basic_string_view<char> *)(in_RDI + 8));
    in_stack_ffffffffffffffb0 = *in_RSI;
    in_stack_ffffffffffffffc0 = in_RSI[2];
    in_stack_ffffffffffffffc8 = in_RSI[3];
    it_00.super_truncating_iterator_base<wchar_t_*>.limit_ = (size_t)in_stack_ffffffffffffff98;
    it_00.super_truncating_iterator_base<wchar_t_*>.out_ = (wchar_t *)in_stack_ffffffffffffff90;
    it_00.super_truncating_iterator_base<wchar_t_*>.count_ = (size_t)in_stack_ffffffffffffffa0;
    it_00.blackhole_ = in_stack_ffffffffffffffa8;
    it_00._28_4_ = in_stack_ffffffffffffffac;
    internal::
    copy_str<wchar_t,char_const*,fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,it_00);
    *in_RSI = in_stack_ffffffffffffffd0;
    in_RSI[1] = in_stack_ffffffffffffffd8;
    in_RSI[2] = local_20;
    *(undefined4 *)(in_RSI + 3) = local_18;
  }
  __first.super_truncating_iterator_base<wchar_t_*>.limit_ = in_stack_ffffffffffffffc8;
  __first.super_truncating_iterator_base<wchar_t_*>.out_ = (wchar_t *)in_stack_ffffffffffffffc0;
  __first.super_truncating_iterator_base<wchar_t_*>.count_ = in_stack_ffffffffffffffd0;
  __first._24_8_ = in_stack_ffffffffffffffd8;
  std::
  fill_n<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,unsigned_long,wchar_t>
            (__first,in_stack_ffffffffffffffb0,
             (wchar_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  *in_RSI = in_stack_ffffffffffffff90;
  in_RSI[1] = (size_t)in_stack_ffffffffffffff98;
  in_RSI[2] = (size_t)in_stack_ffffffffffffffa0;
  *(undefined4 *)(in_RSI + 3) = in_stack_ffffffffffffffa8;
  int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>::operator()
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }